

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

bool __thiscall CLOptions::AsBool(CLOptions *this,string *param_name)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *ppCVar3;
  ostream *poVar4;
  
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
          ::count(&this->params_bools,param_name);
  if (sVar2 != 0) {
    ppCVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
              ::operator[](&this->params_bools,param_name);
    bVar1 = CLParam<bool>::getValue((CLParam<bool> *)*ppCVar3);
    return bVar1;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"[ERROR] CLOptions::AsBool() :: Parameter \"");
  poVar4 = std::operator<<(poVar4,(string *)param_name);
  poVar4 = std::operator<<(poVar4,"\" is not a bool!");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool CLOptions::AsBool(const std::string& param_name)
{
    if (params_bools.count(param_name) == 0) {
        std::cerr << "[ERROR] CLOptions::AsBool() :: Parameter \"" << param_name << "\" is not a bool!" << std::endl;
        return false ;
    } else {
        return params_bools[param_name]->getValue();
    }
}